

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_resend_hello_request(mbedtls_ssl_context *ssl)

{
  int iVar1;
  mbedtls_ssl_config *pmVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  pmVar2 = ssl->conf;
  if (pmVar2->renego_max_records < 0) {
    uVar4 = pmVar2->hs_timeout_max / pmVar2->hs_timeout_min;
    uVar6 = uVar4 + 1;
    uVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    iVar5 = 1;
    if (uVar4 != 0xffffffff) {
      iVar5 = (uVar3 ^ 0xffffffe0) + 0x22;
    }
    iVar1 = ssl->renego_records_seen;
    ssl->renego_records_seen = iVar1 + 1;
    if (iVar5 <= iVar1) {
      return 0;
    }
  }
  ssl->out_msglen = 4;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\0';
  iVar5 = mbedtls_ssl_write_record(ssl);
  return iVar5;
}

Assistant:

static int ssl_resend_hello_request( mbedtls_ssl_context *ssl )
{
    /* If renegotiation is not enforced, retransmit until we would reach max
     * timeout if we were using the usual handshake doubling scheme */
    if( ssl->conf->renego_max_records < 0 )
    {
        uint32_t ratio = ssl->conf->hs_timeout_max / ssl->conf->hs_timeout_min + 1;
        unsigned char doublings = 1;

        while( ratio != 0 )
        {
            ++doublings;
            ratio >>= 1;
        }

        if( ++ssl->renego_records_seen > doublings )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "no longer retransmitting hello request" ) );
            return( 0 );
        }
    }

    return( ssl_write_hello_request( ssl ) );
}